

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::verify
          (MemoryTestInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *this_00;
  TestLog *log;
  ulong __n;
  pointer ppCVar1;
  Command *pCVar2;
  bool bVar3;
  undefined7 extraout_var;
  ScopedLogSection section;
  VerifyContext verifyContext;
  ScopedLogSection SStack_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  string local_260;
  string local_240;
  undefined1 local_220 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  TextureLevel local_1d8;
  MessageBuilder local_1b0;
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  de::toString<unsigned_int>(&local_280,&this->m_memoryTypeNdx);
  std::operator+(&local_320,"MemoryType",&local_280);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                 &local_320,"Verify");
  de::toString<unsigned_long>(&local_2c0,&this->m_iteration);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                 &local_2c0);
  de::toString<unsigned_int>(&local_260,&this->m_memoryTypeNdx);
  std::operator+(&local_2a0,"Memory type ",&local_260);
  std::operator+(&local_300,&local_2a0," verify iteration ");
  de::toString<unsigned_long>(&local_240,&this->m_iteration);
  std::operator+(&local_2e0,&local_300,&local_240);
  tcu::ScopedLogSection::ScopedLogSection(&SStack_328,log,(string *)&local_1b0,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_280);
  local_220._8_8_ = &this->m_resultCollector;
  local_220._16_8_ =
       (this->m_renderContext).
       super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
       .m_data.ptr;
  __n = (this->m_config).size;
  local_1b0.m_log = (TestLog *)((ulong)local_1b0.m_log & 0xffffffffffffff00);
  local_220._0_8_ = log;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_208,__n,(value_type_conflict5 *)&local_1b0,(allocator_type *)&local_320);
  local_1b0.m_log = (TestLog *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1f0,((__n >> 6) + 1) - (ulong)((__n & 0x3f) == 0),
             (value_type_conflict4 *)&local_1b0,(allocator_type *)&local_320);
  tcu::TextureLevel::TextureLevel(&local_1d8);
  this_00 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Begin verify");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  local_2a0._M_dataplus._M_p = (pointer)0x0;
  while( true ) {
    ppCVar1 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)((long)(this->m_commands).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <=
        local_2a0._M_dataplus._M_p) break;
    pCVar2 = ppCVar1[(long)local_2a0._M_dataplus._M_p];
    (*pCVar2->_vptr_Command[7])(pCVar2,local_220);
    local_2a0._M_dataplus._M_p = local_2a0._M_dataplus._M_p + 1;
  }
  bVar3 = nextIteration(this);
  VerifyContext::~VerifyContext((VerifyContext *)local_220);
  tcu::ScopedLogSection::~ScopedLogSection(&SStack_328);
  return (int)CONCAT71(extraout_var,bVar3);
}

Assistant:

bool MemoryTestInstance::verify (void)
{
	DE_ASSERT(!m_commands.empty());

	TestLog&					log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section			(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Verify" + de::toString(m_iteration),
													  "Memory type " + de::toString(m_memoryTypeNdx) + " verify iteration " + de::toString(m_iteration));
	VerifyContext				verifyContext	(log, m_resultCollector, *m_renderContext, m_config.size);

	log << TestLog::Message << "Begin verify" << TestLog::EndMessage;

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.verify(verifyContext, cmdNdx);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to verify, got exception: " + string(e.getMessage()));
			return nextIteration();
		}
	}

	return nextIteration();
}